

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

bool __thiscall
mp::internal::TextReader<fmt::Locale>::ReadIntWithoutSign<unsigned_int>
          (TextReader<fmt::Locale> *this,uint *value)

{
  char cVar1;
  long lVar2;
  CStringRef arg0;
  CStringRef arg0_00;
  uint uVar3;
  uint *in_RSI;
  long *in_RDI;
  UInt max;
  UInt new_result;
  UInt result;
  char c;
  bool local_49;
  BasicCStringRef<char> local_40;
  uint local_34;
  BasicCStringRef<char> local_30;
  undefined4 in_stack_ffffffffffffffd8;
  uint uVar4;
  undefined3 in_stack_ffffffffffffffe4;
  undefined4 uVar5;
  bool local_1;
  
  cVar1 = *(char *)*in_RDI;
  uVar5 = CONCAT13(cVar1,in_stack_ffffffffffffffe4);
  if ((cVar1 < '0') || ('9' < cVar1)) {
    local_1 = false;
  }
  else {
    uVar4 = 0;
    do {
      uVar3 = uVar4 * 10 + (char)((uint)uVar5 >> 0x18) + -0x30;
      if (uVar3 < uVar4) {
        fmt::BasicCStringRef<char>::BasicCStringRef(&local_30,"number is too big");
        arg0.data_._4_4_ = uVar5;
        arg0.data_._0_4_ = uVar4;
        ReportError<>((TextReader<fmt::Locale> *)CONCAT44(uVar3,in_stack_ffffffffffffffd8),arg0);
      }
      lVar2 = *in_RDI;
      *in_RDI = lVar2 + 1;
      cVar1 = *(char *)(lVar2 + 1);
      uVar5 = CONCAT13(cVar1,(int3)uVar5);
      local_49 = '/' < cVar1 && cVar1 < ':';
      uVar4 = uVar3;
    } while (local_49);
    local_34 = std::numeric_limits<unsigned_int>::max();
    if (local_34 < uVar4) {
      fmt::BasicCStringRef<char>::BasicCStringRef(&local_40,"number is too big");
      arg0_00.data_._4_4_ = uVar5;
      arg0_00.data_._0_4_ = uVar4;
      ReportError<>((TextReader<fmt::Locale> *)CONCAT44(uVar3,in_stack_ffffffffffffffd8),arg0_00);
    }
    *in_RSI = uVar4;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool ReadIntWithoutSign(Int& value) {
    char c = *ptr_;
    if (c < '0' || c > '9')
      return false;
    typedef typename MakeUnsigned<Int>::Type UInt;
    UInt result = 0;
    do {
      UInt new_result = result * 10 + (c - '0');
      if (new_result < result)
        ReportError("number is too big");
      result = new_result;
      c = *++ptr_;
    } while (c >= '0' && c <= '9');
    UInt max = std::numeric_limits<Int>::max();
    if (result > max)
      ReportError("number is too big");
    value = result;
    return true;
  }